

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall
CompareBoundaryRelation::WedgesCross
          (CompareBoundaryRelation *this,S2Point *a0,S2Point *ab1,S2Point *a2,S2Point *b0,
          S2Point *b2)

{
  bool bVar1;
  S2Point *b2_local;
  S2Point *b0_local;
  S2Point *a2_local;
  S2Point *ab1_local;
  S2Point *a0_local;
  CompareBoundaryRelation *this_local;
  
  this->found_shared_vertex_ = true;
  bVar1 = WedgeContainsSemiwedge(a0,ab1,a2,b2,(bool)(this->reverse_b_ & 1));
  if (bVar1) {
    this->contains_edge_ = true;
  }
  else {
    this->excludes_edge_ = true;
  }
  return (this->contains_edge_ & 1U & this->excludes_edge_ & 1U) != 0;
}

Assistant:

bool WedgesCross(const S2Point& a0, const S2Point& ab1, const S2Point& a2,
                   const S2Point& b0, const S2Point& b2) override {
    // Because we don't care about the interior of B, only its boundary, it is
    // sufficient to check whether A contains the semiwedge (ab1, b2).
    found_shared_vertex_ = true;
    if (WedgeContainsSemiwedge(a0, ab1, a2, b2, reverse_b_)) {
      contains_edge_ = true;
    } else {
      excludes_edge_ = true;
    }
    return contains_edge_ & excludes_edge_;
  }